

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O2

void __thiscall AdaptorSignature_Verify_Test::TestBody(AdaptorSignature_Verify_Test *this)

{
  bool bVar1;
  char *in_R9;
  allocator local_eb;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  AdaptorSignature adaptor_sig;
  AssertionResult gtest_ar_;
  
  std::__cxx11::string::string
            ((string *)&local_e8,
             "03424d14a5471c048ab87b3b83f6085d125d5864249ae4297a57c84e74710bb6730223f325042fce535d040fee52ec13231bf709ccd84233c6944b90317e62528b2527dff9d659a96db4c99f9750168308633c1867b70f3a18fb0f4539a1aecedcd1fc0148fc22f36b6303083ece3f872b18e35d368b3958efe5fb081f7716736ccb598d269aa3084d57e1855e1ea9a45efc10463bbf32ae378029f5763ceb40173f"
             ,(allocator *)&local_c8);
  cfd::core::AdaptorSignature::AdaptorSignature(&adaptor_sig,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string
            ((string *)&local_e8,"8131e6f4b45754f2c90bd06688ceeabc0c45055460729928b4eecf11026a9e2d",
             &local_e9);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_58,&local_e8);
  std::__cxx11::string::string
            ((string *)&local_c8,
             "035be5e9478209674a96e60f1f037f6176540fd001fa1d64694770c56a7709c42c",&local_ea);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_70,&local_c8);
  std::__cxx11::string::string
            ((string *)&local_a8,
             "02c2662c97488b07b6e819124b8989849206334a4c2fbdf691f7b34d2b16e9c293",&local_eb);
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_88,&local_a8);
  bVar1 = cfd::core::AdaptorSignature::Verify
                    (&adaptor_sig,(ByteData256 *)&local_58,(Pubkey *)&local_70,(Pubkey *)&local_88);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = bVar1;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  std::__cxx11::string::~string((string *)&local_c8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  std::__cxx11::string::~string((string *)&local_e8);
  if (!bVar1) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)&gtest_ar_,
               (AssertionResult *)
               "adaptor_sig.Verify( ByteData256(\"8131e6f4b45754f2c90bd06688ceeabc0c45055460729928b4eecf11026a9e2d\"), Pubkey(\"035be5e9478209674a96e60f1f037f6176540fd001fa1d64694770c56a7709c42c\"), Pubkey(\"02c2662c97488b07b6e819124b8989849206334a4c2fbdf691f7b34d2b16e9c293\"))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x2c,local_e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&adaptor_sig);
  return;
}

Assistant:

TEST(AdaptorSignature, Verify) {
  AdaptorSignature adaptor_sig("03424d14a5471c048ab87b3b83f6085d125d5864249ae4297a57c84e74710bb6730223f325042fce535d040fee52ec13231bf709ccd84233c6944b90317e62528b2527dff9d659a96db4c99f9750168308633c1867b70f3a18fb0f4539a1aecedcd1fc0148fc22f36b6303083ece3f872b18e35d368b3958efe5fb081f7716736ccb598d269aa3084d57e1855e1ea9a45efc10463bbf32ae378029f5763ceb40173f");  // NOLINT

  EXPECT_TRUE(
      adaptor_sig.Verify(
          ByteData256("8131e6f4b45754f2c90bd06688ceeabc0c45055460729928b4eecf11026a9e2d"),  // NOLINT
          Pubkey("035be5e9478209674a96e60f1f037f6176540fd001fa1d64694770c56a7709c42c"),  // NOLINT
          Pubkey("02c2662c97488b07b6e819124b8989849206334a4c2fbdf691f7b34d2b16e9c293")));  // NOLINT
}